

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

bool __thiscall DiskTableNode::intersect(DiskTableNode *this,SSTableData *rhs)

{
  long lVar1;
  pointer pSVar2;
  pointer pSVar3;
  bool local_42;
  bool local_41;
  longlong rkey_max;
  longlong local_28;
  longlong rkey_min;
  SSTableHeader *h;
  SSTableData *rhs_local;
  DiskTableNode *this_local;
  
  h = (SSTableHeader *)rhs;
  rhs_local = (SSTableData *)this;
  rkey_min = (longlong)getHeader(this);
  rkey_max = (longlong)
             std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin
                       ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)h);
  pSVar2 = __gnu_cxx::
           __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
           ::operator->((__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                         *)&rkey_max);
  local_28 = pSVar2->key;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::rbegin
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)&stack0xffffffffffffffc0
            );
  pSVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
                         *)&stack0xffffffffffffffc0);
  lVar1 = pSVar3->key;
  if (((local_28 < *(long *)(rkey_min + 0x10)) ||
      (local_41 = true, *(long *)(rkey_min + 0x18) < local_28)) &&
     ((lVar1 < *(long *)(rkey_min + 0x10) || (local_41 = true, *(long *)(rkey_min + 0x18) < lVar1)))
     ) {
    local_42 = false;
    if (local_28 <= *(long *)(rkey_min + 0x10)) {
      local_42 = *(long *)(rkey_min + 0x18) <= lVar1;
    }
    local_41 = local_42;
  }
  return local_41;
}

Assistant:

bool DiskTableNode::intersect(SSTableData &rhs) {
    auto *h = getHeader();
    auto rkey_min = rhs.begin()->key;
    auto rkey_max = rhs.rbegin()->key;
    return ((rkey_min >= h->key_min && rkey_min <= h->key_max) ||
            (rkey_max >= h->key_min && rkey_max <= h->key_max)) ||
           (h->key_min >= rkey_min && h->key_max <= rkey_max);
}